

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O3

Token __thiscall slang::syntax::SyntaxNode::getFirstToken(SyntaxNode *this)

{
  SyntaxNode *pSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar3;
  ConstGetChildVisitor *in_RCX;
  unsigned_long *in_R8;
  SyntaxNode *node;
  Token TVar4;
  ConstTokenOrSyntax child;
  Token local_48;
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_38;
  undefined1 auVar5 [14];
  Info *pIVar6;
  
  pSVar1 = (SyntaxNode *)getChildCount(this);
  if (pSVar1 != (SyntaxNode *)0x0) {
    node = (SyntaxNode *)0x0;
    do {
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::ConstGetChildVisitor,unsigned_long&>
                ((ConstTokenOrSyntax *)&local_38,(detail *)this,node,in_RCX,in_R8);
      if (local_38.super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          _M_index == '\0') {
        pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_38);
        if (pvVar3->info != (Info *)0x0) {
          pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_38);
          TVar4.kind = pvVar3->kind;
          auVar5[2] = pvVar3->field_0x2;
          auVar5[3] = (pvVar3->numFlags).raw;
          auVar5._4_4_ = pvVar3->rawLen;
          register0x00000010 = pvVar3->info;
          return TVar4;
        }
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_38);
        if (*ppSVar2 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
          ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(&local_38);
          local_48 = getFirstToken(*ppSVar2);
          if (local_48.info != (Info *)0x0) {
            return local_48;
          }
        }
      }
      node = (SyntaxNode *)((long)&node->parent + 1);
    } while (pSVar1 != node);
  }
  parsing::Token::Token(&local_48);
  return local_48;
}

Assistant:

parsing::Token SyntaxNode::getFirstToken() const {
    size_t childCount = getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        auto child = getChild(i);
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getFirstToken();
            if (result)
                return result;
        }
    }
    return Token();
}